

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::iterationAnalysisMajor(HEkkDual *this)

{
  HEkk *this_00;
  HighsSimplexAnalysis *pHVar1;
  HighsInt HVar2;
  bool bVar3;
  
  this_00 = this->ekk_instance_;
  pHVar1 = this->analysis;
  pHVar1->numerical_trouble = this->numericalTrouble;
  HVar2 = (this_00->info_).num_concurrency;
  pHVar1->min_concurrency = (this_00->info_).min_concurrency;
  pHVar1->num_concurrency = HVar2;
  pHVar1->max_concurrency = (this_00->info_).max_concurrency;
  if (this->edge_weight_mode == kSteepestEdge) {
    bVar3 = HEkk::switchToDevex(this_00);
    if (bVar3) {
      this->edge_weight_mode = kDevex;
      initialiseDevexFramework(this);
    }
  }
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::iterationRecord(this->analysis);
    HighsSimplexAnalysis::iterationRecordMajor(this->analysis);
    return;
  }
  return;
}

Assistant:

void HEkkDual::iterationAnalysisMajor() {
  iterationAnalysisMajorData();
  // Possibly switch from DSE to Devex
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    bool switch_to_devex = false;
    //    switch_to_devex = analysis->switchToDevex();
    switch_to_devex = ekk_instance_.switchToDevex();
    if (switch_to_devex) {
      edge_weight_mode = EdgeWeightMode::kDevex;
      // Set up the Devex framework
      initialiseDevexFramework();
    }
  }
  if (analysis->analyse_simplex_summary_data) {
    analysis->iterationRecord();
    analysis->iterationRecordMajor();
  }
}